

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexIntegrityCheck(Fts5Index *p,u64 cksum)

{
  int iVar1;
  int iVar2;
  i64 iRowid_00;
  u8 *pTerm;
  u64 uVar3;
  int iTokOff;
  int iCol;
  char *z;
  i64 iRowid;
  i64 iStack_70;
  int iOff;
  i64 iPos;
  Fts5StructureSegment *pFStack_60;
  int n;
  Fts5StructureSegment *pSeg;
  int local_50;
  int iSeg;
  int iLvl;
  int flags;
  Fts5Structure *pStruct;
  Fts5Iter *pIter;
  Fts5Buffer poslist;
  u64 cksum2;
  int eDetail;
  u64 cksum_local;
  Fts5Index *p_local;
  
  iVar2 = p->pConfig->eDetail;
  poslist.n = 0;
  poslist.nSpace = 0;
  memset(&pIter,0,0x10);
  iSeg = 0x20;
  _iLvl = fts5StructureRead(p);
  if (_iLvl != (Fts5Structure *)0x0) {
    for (local_50 = 0; local_50 < _iLvl->nLevel; local_50 = local_50 + 1) {
      for (pSeg._4_4_ = 0; pSeg._4_4_ < _iLvl->aLevel[local_50].nSeg; pSeg._4_4_ = pSeg._4_4_ + 1) {
        pFStack_60 = _iLvl->aLevel[local_50].aSeg + pSeg._4_4_;
        fts5IndexIntegrityCheckSegment(p,pFStack_60);
      }
    }
  }
  fts5MultiIterNew(p,_iLvl,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,-1,0,(Fts5Iter **)&pStruct);
  while (iVar1 = fts5MultiIterEof(p,(Fts5Iter *)pStruct), iVar1 == 0) {
    iStack_70 = 0;
    iRowid._4_4_ = 0;
    iRowid_00 = fts5MultiIterRowid((Fts5Iter *)pStruct);
    pTerm = fts5MultiIterTerm((Fts5Iter *)pStruct,(int *)((long)&iPos + 4));
    if (iVar2 == 1) {
      iVar1 = fts5MultiIterIsEmpty(p,(Fts5Iter *)pStruct);
      if (iVar1 == 0) {
        uVar3 = sqlite3Fts5IndexEntryCksum(iRowid_00,0,0,-1,(char *)pTerm,iPos._4_4_);
        poslist._8_8_ = uVar3 ^ poslist._8_8_;
      }
    }
    else {
      poslist.p._0_4_ = 0;
      fts5SegiterPoslist(p,(Fts5SegIter *)
                           &pStruct[(ulong)*(ushort *)(pStruct[2].nWriteCounter + 4) * 3 + 2].
                            nSegment,(Fts5Colset *)0x0,(Fts5Buffer *)&pIter);
      while (iVar1 = sqlite3Fts5PoslistNext64
                               ((u8 *)pIter,(int)poslist.p,(int *)((long)&iRowid + 4),
                                &stack0xffffffffffffff90), iVar1 == 0) {
        uVar3 = sqlite3Fts5IndexEntryCksum
                          (iRowid_00,(int)((ulong)iStack_70 >> 0x20),(uint)iStack_70 & 0x7fffffff,-1
                           ,(char *)pTerm,iPos._4_4_);
        poslist._8_8_ = uVar3 ^ poslist._8_8_;
      }
    }
    fts5MultiIterNext(p,(Fts5Iter *)pStruct,0,0);
  }
  fts5MultiIterFree((Fts5Iter *)pStruct);
  if ((p->rc == 0) && (cksum != poslist._8_8_)) {
    p->rc = 0x10b;
  }
  fts5StructureRelease(_iLvl);
  sqlite3Fts5BufferFree((Fts5Buffer *)&pIter);
  iVar2 = fts5IndexReturn(p);
  return iVar2;
}

Assistant:

static int sqlite3Fts5IndexIntegrityCheck(Fts5Index *p, u64 cksum){
  int eDetail = p->pConfig->eDetail;
  u64 cksum2 = 0;                 /* Checksum based on contents of indexes */
  Fts5Buffer poslist = {0,0,0};   /* Buffer used to hold a poslist */
  Fts5Iter *pIter;                /* Used to iterate through entire index */
  Fts5Structure *pStruct;         /* Index structure */

#ifdef SQLITE_DEBUG
  /* Used by extra internal tests only run if NDEBUG is not defined */
  u64 cksum3 = 0;                 /* Checksum based on contents of indexes */
  Fts5Buffer term = {0,0,0};      /* Buffer used to hold most recent term */
#endif
  const int flags = FTS5INDEX_QUERY_NOOUTPUT;
  
  /* Load the FTS index structure */
  pStruct = fts5StructureRead(p);

  /* Check that the internal nodes of each segment match the leaves */
  if( pStruct ){
    int iLvl, iSeg;
    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
        Fts5StructureSegment *pSeg = &pStruct->aLevel[iLvl].aSeg[iSeg];
        fts5IndexIntegrityCheckSegment(p, pSeg);
      }
    }
  }

  /* The cksum argument passed to this function is a checksum calculated
  ** based on all expected entries in the FTS index (including prefix index
  ** entries). This block checks that a checksum calculated based on the
  ** actual contents of FTS index is identical.
  **
  ** Two versions of the same checksum are calculated. The first (stack
  ** variable cksum2) based on entries extracted from the full-text index
  ** while doing a linear scan of each individual index in turn. 
  **
  ** As each term visited by the linear scans, a separate query for the
  ** same term is performed. cksum3 is calculated based on the entries
  ** extracted by these queries.
  */
  for(fts5MultiIterNew(p, pStruct, flags, 0, 0, 0, -1, 0, &pIter);
      fts5MultiIterEof(p, pIter)==0;
      fts5MultiIterNext(p, pIter, 0, 0)
  ){
    int n;                      /* Size of term in bytes */
    i64 iPos = 0;               /* Position read from poslist */
    int iOff = 0;               /* Offset within poslist */
    i64 iRowid = fts5MultiIterRowid(pIter);
    char *z = (char*)fts5MultiIterTerm(pIter, &n);

    /* If this is a new term, query for it. Update cksum3 with the results. */
    fts5TestTerm(p, &term, z, n, cksum2, &cksum3);

    if( eDetail==FTS5_DETAIL_NONE ){
      if( 0==fts5MultiIterIsEmpty(p, pIter) ){
        cksum2 ^= sqlite3Fts5IndexEntryCksum(iRowid, 0, 0, -1, z, n);
      }
    }else{
      poslist.n = 0;
      fts5SegiterPoslist(p, &pIter->aSeg[pIter->aFirst[1].iFirst], 0, &poslist);
      while( 0==sqlite3Fts5PoslistNext64(poslist.p, poslist.n, &iOff, &iPos) ){
        int iCol = FTS5_POS2COLUMN(iPos);
        int iTokOff = FTS5_POS2OFFSET(iPos);
        cksum2 ^= sqlite3Fts5IndexEntryCksum(iRowid, iCol, iTokOff, -1, z, n);
      }
    }
  }
  fts5TestTerm(p, &term, 0, 0, cksum2, &cksum3);

  fts5MultiIterFree(pIter);
  if( p->rc==SQLITE_OK && cksum!=cksum2 ) p->rc = FTS5_CORRUPT;

  fts5StructureRelease(pStruct);
#ifdef SQLITE_DEBUG
  fts5BufferFree(&term);
#endif
  fts5BufferFree(&poslist);
  return fts5IndexReturn(p);
}